

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O3

size_t __thiscall Pathie::Path::component_count(Path *this)

{
  long lVar1;
  size_t sVar2;
  
  if (((this->m_path)._M_string_length != 1) || (sVar2 = 1, *(this->m_path)._M_dataplus._M_p != '/')
     ) {
    sVar2 = 1;
    lVar1 = std::__cxx11::string::find((char *)this,0x10f1b8,0);
    if (lVar1 != -1) {
      sVar2 = 1;
      do {
        lVar1 = std::__cxx11::string::find((char *)this,0x10f1b8,lVar1 + 1);
        sVar2 = sVar2 + 1;
      } while (lVar1 != -1);
    }
  }
  return sVar2;
}

Assistant:

size_t Path::component_count() const
{
  if (is_root())
    return 1;

  size_t result = 0;
  size_t pos = 0;
  while ((pos = m_path.find("/", pos)) != string::npos) { // Assignment intended
    result++;
    pos++;
  }

  return ++result;
}